

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O2

bool __thiscall QHstsHeaderParser::parse(QHstsHeaderParser *this,QHttpHeaders *headers)

{
  undefined8 uVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  QDateTime aQStack_58 [8];
  undefined8 local_50;
  QArrayDataPointer<QByteArray> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QHttpHeaders::values((QList<QByteArray> *)&local_48,headers,StrictTransportSecurity);
  iVar3 = QList<QByteArray>::begin((QList<QByteArray> *)&local_48);
  iVar4 = QList<QByteArray>::end((QList<QByteArray> *)&local_48);
  do {
    if (iVar3.i == iVar4.i) {
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
      this->subDomainsFound = false;
LAB_0016c6d3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return iVar3.i != iVar4.i;
      }
      __stack_chk_fail();
    }
    QByteArray::operator=(&this->header,iVar3.i);
    bVar2 = parseSTSHeader(this);
    if ((bVar2) && (this->maxAgeFound == true)) {
      QDateTime::currentDateTimeUtc();
      QDateTime::addSecs((longlong)&local_50);
      uVar1 = *(undefined8 *)&this->expiry;
      *(undefined8 *)&this->expiry = local_50;
      local_50 = uVar1;
      QDateTime::~QDateTime((QDateTime *)&local_50);
      QDateTime::~QDateTime(aQStack_58);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
      goto LAB_0016c6d3;
    }
    iVar3.i = iVar3.i + 1;
  } while( true );
}

Assistant:

bool QHstsHeaderParser::parse(const QHttpHeaders &headers)
{
    for (const auto &value : headers.values(
                 QHttpHeaders::WellKnownHeader::StrictTransportSecurity)) {
        header = value;
        // RFC6797, 8.1:
        //
        //  The UA MUST ignore any STS header fields not conforming to the
        // grammar specified in Section 6.1 ("Strict-Transport-Security HTTP
        // Response Header Field").
        //
        // If a UA receives more than one STS header field in an HTTP
        // response message over secure transport, then the UA MUST process
        // only the first such header field.
        //
        // We read this as: ignore all invalid headers and take the first valid:
        if (parseSTSHeader() && maxAgeFound) {
            expiry = QDateTime::currentDateTimeUtc().addSecs(maxAge);
            return true;
        }
    }

    // In case it was set by a syntactically correct header (but without
    // REQUIRED max-age directive):
    subDomainsFound = false;

    return false;
}